

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

uint ON_MeshNgon::IsValid
               (ON_MeshNgon *ngon,uint ngon_index,ON_TextLog *text_logx,uint mesh_vertex_count,
               uint mesh_face_count,ON_MeshFace *mesh_F,
               ON_SimpleArray<unsigned_int> *workspace_buffer)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ON_MeshFace *this;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  ON_TextLog *this_00;
  uint uVar13;
  uint nvi;
  
  if (-1 < workspace_buffer->m_capacity) {
    workspace_buffer->m_count = 0;
  }
  if (ngon == (ON_MeshNgon *)0x0) {
    return 1;
  }
  this_00 = (ON_TextLog *)((ulong)text_logx & 0xfffffffffffffffe);
  uVar2 = ngon->m_Vcount;
  uVar7 = (ulong)uVar2;
  if (uVar7 < 3) {
    if (this_00 == (ON_TextLog *)0x0) goto joined_r0x00510237;
    pcVar12 = "ON_Mesh.Ngon(%u)->m_Vcount < 3.\n";
  }
  else {
    uVar8 = ngon->m_Fcount;
    if ((ulong)uVar8 != 0) {
      puVar4 = ngon->m_vi;
      if (puVar4 == (uint *)0x0) {
        if (this_00 == (ON_TextLog *)0x0) goto joined_r0x00510237;
        pcVar12 = "ON_Mesh.Ngon(%u)->m_vi is nullptr.\n";
      }
      else {
        puVar5 = ngon->m_fi;
        if (puVar5 != (uint *)0x0) {
          for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
            if (mesh_vertex_count <= puVar4[uVar3]) {
              if (this_00 == (ON_TextLog *)0x0) goto joined_r0x00510237;
              pcVar12 = "ON_Mesh.Ngon(%u)->m_vi[%u] is invalid.\n";
              goto LAB_0051022b;
            }
          }
          for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
            if (mesh_face_count <= puVar5[uVar3]) {
              if (this_00 == (ON_TextLog *)0x0) goto joined_r0x00510237;
              pcVar12 = "ON_Mesh.Ngon(%u)->m_fi[%u] is invalid.\n";
              goto LAB_0051022b;
            }
          }
          if (mesh_F == (ON_MeshFace *)0x0) {
            return 1;
          }
          if (uVar2 - 3 < 2 && uVar8 == 1) {
            this = mesh_F + *puVar5;
            bVar1 = ON_MeshFace::IsValid(this,mesh_vertex_count);
            if (!bVar1) {
              if (this_00 == (ON_TextLog *)0x0) goto joined_r0x00510237;
              pcVar12 = "ON_Mesh.Ngon(%u)->m_fi[0] is invalid.\n";
              goto LAB_00510129;
            }
            uVar3 = 0;
            while (uVar6 = uVar3, uVar6 != uVar7) {
              if (this->vi[0] == puVar4[uVar6]) {
                uVar3 = uVar6 + 1;
                if (this->vi[1] == puVar4[(uVar3 & 0xffffffff) % uVar7]) {
                  if (this->vi[2] == puVar4[(ulong)((int)uVar6 + 2) % uVar7]) {
                    if (uVar7 == 4) {
                      if (this->vi[3] == puVar4[(int)uVar6 - 1U & 3]) {
                        return uVar2;
                      }
                    }
                    else if ((uVar2 == 3) && (this->vi[3] == this->vi[2])) {
                      return 3;
                    }
                  }
                }
              }
              else {
                uVar3 = uVar6 + 1;
              }
            }
          }
          puVar4 = ON_SimpleArray<unsigned_int>::Reserve(workspace_buffer,(ulong)(uVar8 * 8));
          uVar2 = ngon->m_Fcount;
          uVar8 = 0;
          for (uVar7 = 0; uVar3 = (ulong)uVar8, uVar2 != uVar7; uVar7 = uVar7 + 1) {
            uVar9 = ngon->m_fi[uVar7];
            uVar10 = mesh_F[uVar9].vi[0];
            uVar13 = mesh_F[uVar9].vi[3];
            uVar11 = uVar10;
            if ((uVar13 < uVar10) ||
               (bVar1 = uVar10 < uVar13, uVar11 = uVar13, uVar13 = uVar10, bVar1)) {
              puVar4[uVar3 * 2] = uVar13;
              uVar8 = uVar8 + 1;
              puVar4[uVar3 * 2 + 1] = uVar11;
            }
            uVar13 = mesh_F[uVar9].vi[1];
            uVar11 = uVar13;
            if ((uVar10 < uVar13) ||
               (bVar1 = uVar13 < uVar10, uVar11 = uVar10, uVar10 = uVar13, bVar1)) {
              uVar3 = (ulong)uVar8;
              puVar4[uVar3 * 2] = uVar10;
              uVar8 = uVar8 + 1;
              puVar4[uVar3 * 2 + 1] = uVar11;
            }
            uVar10 = mesh_F[uVar9].vi[2];
            uVar11 = uVar10;
            if ((uVar13 < uVar10) ||
               (bVar1 = uVar10 < uVar13, uVar11 = uVar13, uVar13 = uVar10, bVar1)) {
              uVar3 = (ulong)uVar8;
              puVar4[uVar3 * 2] = uVar13;
              uVar8 = uVar8 + 1;
              puVar4[uVar3 * 2 + 1] = uVar11;
            }
            uVar9 = mesh_F[uVar9].vi[3];
            uVar13 = uVar9;
            if ((uVar10 < uVar9) || (bVar1 = uVar9 < uVar10, uVar13 = uVar10, uVar10 = uVar9, bVar1)
               ) {
              uVar3 = (ulong)uVar8;
              puVar4[uVar3 * 2] = uVar10;
              uVar8 = uVar8 + 1;
              puVar4[uVar3 * 2 + 1] = uVar13;
            }
          }
          if (ngon->m_Vcount <= uVar8) {
            ON_qsort(puVar4,uVar3,8,compare2u);
            uVar3 = 0;
            uVar7 = 0;
LAB_00510331:
            uVar2 = (uint)uVar3;
            uVar9 = (uint)uVar7;
            if (uVar2 < uVar8) {
              uVar11 = uVar2 + 1;
              uVar10 = puVar4[(uVar3 & 0xffffffff) * 2];
              uVar13 = puVar4[(uVar3 & 0xffffffff) * 2 + 1];
              if (((uVar11 < uVar8) && (uVar10 == puVar4[(ulong)uVar11 * 2])) &&
                 (uVar13 == puVar4[(ulong)uVar11 * 2 + 1])) {
                for (uVar3 = (ulong)(uVar2 + 2); (uint)uVar3 < uVar8; uVar3 = uVar3 + 1) {
                  if ((uVar10 != puVar4[uVar3 * 2]) || (uVar13 != puVar4[uVar3 * 2 + 1]))
                  goto LAB_00510331;
                }
                uVar3 = (ulong)uVar8;
              }
              else {
                puVar4[uVar7 * 2] = uVar10;
                puVar4[uVar7 * 2 + 1] = uVar13;
                uVar3 = (ulong)uVar11;
                uVar7 = (ulong)(uVar9 + 1);
              }
              goto LAB_00510331;
            }
            if (ngon->m_Vcount <= uVar9) {
              ON_SortUnsignedIntArray(quick_sort,puVar4,(ulong)(uVar9 * 2));
              uVar3 = 0;
              while( true ) {
                if (ngon->m_Vcount <= uVar3) {
                  return uVar9;
                }
                puVar5 = ON_BinarySearchUnsignedIntArray
                                   (ngon->m_vi[uVar3],puVar4,(ulong)(uVar9 * 2));
                if (puVar5 == (uint *)0x0) break;
                uVar3 = uVar3 + 1;
              }
              if (this_00 != (ON_TextLog *)0x0) {
                pcVar12 = "ON_Mesh.Ngon(%u)->m_vi[%u] is not a boundary vertex.\n";
LAB_0051022b:
                ON_TextLog::Print(this_00,pcVar12,(ulong)ngon_index,uVar3 & 0xffffffff);
              }
              goto joined_r0x00510237;
            }
          }
          if (this_00 != (ON_TextLog *)0x0) {
            ON_TextLog::Print(this_00,"ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",
                              (ulong)ngon_index);
          }
          goto joined_r0x00510237;
        }
        if (this_00 == (ON_TextLog *)0x0) goto joined_r0x00510237;
        pcVar12 = "ON_Mesh.Ngon(%u)->m_fi is nullptr.\n";
      }
LAB_00510129:
      ON_TextLog::Print(this_00,pcVar12,(ulong)ngon_index);
      goto joined_r0x00510237;
    }
    if (this_00 == (ON_TextLog *)0x0) goto joined_r0x00510237;
    pcVar12 = "ON_Mesh.Ngon(%u)->m_Fcount < 1.\n";
  }
  ON_TextLog::Print(this_00,pcVar12,(ulong)ngon_index);
joined_r0x00510237:
  if (((ulong)text_logx & 1) == 0) {
    ON_IsNotValid();
  }
  return 0;
}

Assistant:

unsigned int ON_MeshNgon::IsValid(
  const ON_MeshNgon* ngon,
  unsigned int ngon_index,
  ON_TextLog* text_logx,
  unsigned int mesh_vertex_count,
  unsigned int mesh_face_count,
  const ON_MeshFace* mesh_F,
  ON_SimpleArray< unsigned int >& workspace_buffer
  )
{
  workspace_buffer.SetCount(0);
  if ( nullptr == ngon )
    return true; // null ngons are ok

  const ON__INT_PTR lowbit = 1;
  const ON__INT_PTR hightbits = ~lowbit;
  bool bSilentError = ( 0 != (lowbit & ((ON__INT_PTR)text_logx)) );
  ON_TextLog* text_log = (ON_TextLog*)(((ON__INT_PTR)text_logx) & hightbits);

  if (ngon->m_Vcount < 3)
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_Vcount < 3.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if (ngon->m_Fcount < 1)
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_Fcount < 1.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if ( nullptr == ngon->m_vi )
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_vi is nullptr.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if ( nullptr == ngon->m_fi )
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_fi is nullptr.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
  {
    if (ngon->m_vi[nvi] >= mesh_vertex_count)
    {
      if ( text_log )
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_vi[%u] is invalid.\n",ngon_index,nvi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  for (unsigned int nfi = 0; nfi < ngon->m_Fcount; nfi++)
  {
    unsigned int fi = ngon->m_fi[nfi];
    if (fi >= mesh_face_count)
    {
      if (text_log)
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_fi[%u] is invalid.\n", ngon_index, nfi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  if (nullptr == mesh_F)
  {
    // mesh faces are required to check the boundary
    return true;
  }

  if (1 == ngon->m_Fcount && ngon->m_Vcount >= 3 && ngon->m_Vcount <= 4)
  {
    // fast test for a valid single face ngon
    unsigned int fi = ngon->m_fi[0];
    if (false == mesh_F[fi].IsValid(mesh_vertex_count))
    {
      if (text_log)
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_fi[0] is invalid.\n", ngon_index);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
    const unsigned int* fvi = (const unsigned int*)mesh_F[fi].vi;
    for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
    {
      if (fvi[0] == ngon->m_vi[nvi] && fvi[1] == ngon->m_vi[(nvi+1)%ngon->m_Vcount] && fvi[2] == ngon->m_vi[(nvi+2)%ngon->m_Vcount])
      {
        if (3 == ngon->m_Vcount && fvi[3] == fvi[2])
          return 3;
        if (4 == ngon->m_Vcount && fvi[3] == ngon->m_vi[(nvi+3)%ngon->m_Vcount])
          return 4;
      }
    }
    // boundary may be reversed
  }

  unsigned int* workspace = workspace_buffer.Reserve(8*ngon->m_Fcount);
  ON_2udex* edges = (ON_2udex*)workspace;
  unsigned int edge_count = 0;
  for (unsigned int nfi = 0; nfi < ngon->m_Fcount; nfi++)
  {
    unsigned int fi = ngon->m_fi[nfi];

    const unsigned int* fvi = (const unsigned int*)(mesh_F[fi].vi);
    unsigned int vi0;
    unsigned int vi1 = fvi[3];
    for (const unsigned int* fvi1 = fvi + 4; fvi < fvi1; fvi++)
    {
      vi0 = vi1;
      vi1 = *fvi;
      if (vi0 < vi1)
      {
        edges[edge_count].i = vi0;
        edges[edge_count++].j = vi1;
      }
      else if (vi0 > vi1)
      {
        edges[edge_count].i = vi1;
        edges[edge_count++].j = vi0;
      }
    }
  }

  if (edge_count < ngon->m_Vcount)
  {
    if (text_log)
    {
      text_log->Print("ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  ON_qsort(edges, edge_count, sizeof(edges[0]),compare2u);

  unsigned int bdry_edge_count = 0;
  for (unsigned int i = 0; i < edge_count; /*empty iterator*/)
  {
    const ON_2udex e0 = edges[i++];
    if (i < edge_count && e0.i == edges[i].i && e0.j == edges[i].j)
    {
      // not a boundary edge
      for (i++; i < edge_count; i++)
      {
        if (e0.i != edges[i].i || e0.j != edges[i].j)
          break;
      }
    }
    else
    {
      edges[bdry_edge_count++] = e0;
    }
  }

  if (bdry_edge_count < ngon->m_Vcount)
  {
    if (text_log)
    {
      text_log->Print("ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  ON_SortUnsignedIntArray( ON::sort_algorithm::quick_sort, workspace, 2*bdry_edge_count );

  for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
  {
    if ( nullptr == ON_BinarySearchUnsignedIntArray( ngon->m_vi[nvi], workspace, 2*bdry_edge_count) )
    {
      if ( text_log )
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_vi[%u] is not a boundary vertex.\n",ngon_index,nvi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  // It is possible that the ngon is still not valid.
  //
  // If bdry_edge_count > ngon->m_Vcount, then there "could" be one or
  // more inner "holes" and the ngon->m_vi[] could reference a vertex
  // on an inner boundary.
  //
  // The vertices in ngon->m_v[] may not be a proper outer boundary.
  //
  // ...


  return bdry_edge_count;
}